

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O3

float basisu::bell_filter(float t)

{
  float fVar1;
  float fVar2;
  
  fVar2 = -t;
  if (-t <= t) {
    fVar2 = t;
  }
  if (fVar2 < 0.5) {
    return 0.75 - fVar2 * fVar2;
  }
  fVar1 = 0.0;
  if (fVar2 < 1.5) {
    fVar1 = (fVar2 + -1.5) * (fVar2 + -1.5) * 0.5;
  }
  return fVar1;
}

Assistant:

static float bell_filter(float t) /* box (*) box (*) box */
	{
		if (t < 0.0f)
			t = -t;

		if (t < .5f)
			return (.75f - (t * t));

		if (t < 1.5f)
		{
			t = (t - 1.5f);
			return (.5f * (t * t));
		}

		return (0.0f);
	}